

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

_Bool pop3_endofresp(connectdata *conn,char *line,size_t len,int *resp)

{
  int iVar1;
  int iVar2;
  
  if ((len < 4) || (*(int *)line != 0x5252452d)) {
    if ((conn->proto).imapc.state == IMAP_CAPABILITY) {
      if ((len == 0) || (*line != '.')) {
        iVar2 = 0x2a;
      }
      else {
        iVar2 = 0x2b;
      }
    }
    else {
      iVar2 = 0x2b;
      if (len < 3) {
        if (len == 0) {
          return false;
        }
      }
      else {
        iVar1 = bcmp("+OK",line,3);
        if (iVar1 == 0) goto LAB_0048ae97;
      }
      if (*line != '+') {
        return false;
      }
    }
  }
  else {
    iVar2 = 0x2d;
  }
LAB_0048ae97:
  *resp = iVar2;
  return true;
}

Assistant:

static bool pop3_endofresp(struct connectdata *conn, char *line, size_t len,
                           int *resp)
{
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  /* Do we have an error response? */
  if(len >= 4 && !memcmp("-ERR", line, 4)) {
    *resp = '-';

    return TRUE;
  }

  /* Are we processing CAPA command responses? */
  if(pop3c->state == POP3_CAPA) {
    /* Do we have the terminating line? */
    if(len >= 1 && !memcmp(line, ".", 1))
      *resp = '+';
    else
      *resp = '*';

    return TRUE;
  }

  /* Do we have a command or continuation response? */
  if((len >= 3 && !memcmp("+OK", line, 3)) ||
     (len >= 1 && !memcmp("+", line, 1))) {
    *resp = '+';

    return TRUE;
  }

  return FALSE; /* Nothing for us */
}